

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int addAggInfoFunc(sqlite3 *db,AggInfo *pInfo)

{
  AggInfo_func *pAVar1;
  int local_1c;
  AggInfo *pAStack_18;
  int i;
  AggInfo *pInfo_local;
  sqlite3 *db_local;
  
  pAStack_18 = pInfo;
  pInfo_local = (AggInfo *)db;
  pAVar1 = (AggInfo_func *)sqlite3ArrayAllocate(db,pInfo->aFunc,0x18,&pInfo->nFunc,&local_1c);
  pAStack_18->aFunc = pAVar1;
  return local_1c;
}

Assistant:

static int addAggInfoFunc(sqlite3 *db, AggInfo *pInfo){
  int i;
  pInfo->aFunc = sqlite3ArrayAllocate(
       db, 
       pInfo->aFunc,
       sizeof(pInfo->aFunc[0]),
       &pInfo->nFunc,
       &i
  );
  return i;
}